

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagholder.cpp
# Opt level: O1

Value * __thiscall
camp::TagHolder::tag(Value *__return_storage_ptr__,TagHolder *this,Value *id,UserObject *object)

{
  _Base_ptr p_Var1;
  const_iterator cVar2;
  undefined1 *other;
  
  cVar2 = std::
          _Rb_tree<camp::Value,_std::pair<const_camp::Value,_camp::detail::Getter<camp::Value>_>,_std::_Select1st<std::pair<const_camp::Value,_camp::detail::Getter<camp::Value>_>_>,_std::less<camp::Value>,_std::allocator<std::pair<const_camp::Value,_camp::detail::Getter<camp::Value>_>_>_>
          ::find(&(this->m_tags)._M_t,id);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->m_tags)._M_t._M_impl.super__Rb_tree_header) {
    other = Value::nothing;
  }
  else {
    p_Var1 = cVar2._M_node[2]._M_right;
    if (p_Var1 != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1 + 0x10))(__return_storage_ptr__,p_Var1,object);
      return __return_storage_ptr__;
    }
    other = (undefined1 *)&cVar2._M_node[3]._M_parent;
  }
  Value::Value(__return_storage_ptr__,(Value *)other);
  return __return_storage_ptr__;
}

Assistant:

Value TagHolder::tag(const Value& id, const UserObject& object) const
{
    TagsTable::const_iterator it = m_tags.find(id);
    if (it != m_tags.end())
        return it->second.get(object);

    return Value::nothing;
}